

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::process_restart(jpeg_decoder *this)

{
  uint uVar1;
  int iVar2;
  
  for (iVar2 = 0x601; iVar2 != 1; iVar2 = iVar2 + -1) {
    uVar1 = get_char(this);
    if (uVar1 == 0xff) goto LAB_0013d072;
  }
  goto LAB_0013d0fa;
  while( true ) {
    uVar1 = get_char(this);
    iVar2 = iVar2 + -1;
    if (uVar1 != 0xff) break;
LAB_0013d072:
    if (iVar2 + -1 == 0 || iVar2 < 1) goto LAB_0013d0fa;
  }
  iVar2 = this->m_next_restart_num;
  if (uVar1 == iVar2 + 0xd0U) {
    memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
    this->m_eob_run = 0;
    this->m_restarts_left = this->m_restart_interval;
    this->m_next_restart_num = iVar2 + 1U & 7;
    this->m_bits_left = 0x10;
    get_bits_no_markers(this,0x10);
    get_bits_no_markers(this,0x10);
    return;
  }
LAB_0013d0fa:
  stop_decoding(this,JPGD_BAD_RESTART_MARKER);
}

Assistant:

void jpeg_decoder::process_restart()
	{
		int i;
		int c = 0;

		// Align to a byte boundry
		// FIXME: Is this really necessary? get_bits_no_markers() never reads in markers!
		//get_bits_no_markers(m_bits_left & 7);

		// Let's scan a little bit to find the marker, but not _too_ far.
		// 1536 is a "fudge factor" that determines how much to scan.
		for (i = 1536; i > 0; i--)
			if (get_char() == 0xFF)
				break;

		if (i == 0)
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		for (; i > 0; i--)
			if ((c = get_char()) != 0xFF)
				break;

		if (i == 0)
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		// Is it the expected marker? If not, something bad happened.
		if (c != (m_next_restart_num + M_RST0))
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		// Reset each component's DC prediction values.
		memset(&m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

		m_eob_run = 0;

		m_restarts_left = m_restart_interval;

		m_next_restart_num = (m_next_restart_num + 1) & 7;

		// Get the bit buffer going again...

		m_bits_left = 16;
		get_bits_no_markers(16);
		get_bits_no_markers(16);
	}